

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O2

void __thiscall
duckdb::ParquetReader::InitializeScan
          (ParquetReader *this,ClientContext *context,ParquetReaderScanState *state,
          vector<unsigned_long,_true> *groups_to_read)

{
  unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
  *this_00;
  unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
  *this_01;
  unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true> *this_02;
  TProtocol *pTVar1;
  _Head_base<0UL,_duckdb::ColumnReader_*,_false> _Var2;
  undefined1 __p [8];
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  pointer pCVar6;
  type args;
  pointer pTVar7;
  type __args_2;
  _Base_ptr p_Var8;
  type pCVar9;
  long lVar10;
  FileOpenFlags flags;
  undefined1 local_108 [8];
  OpenFileInfo local_100;
  Value disable_prefetch;
  string local_90;
  Value prefetch_all_files;
  
  state->current_group = -1;
  state->finished = false;
  state->offset_in_group = 0;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)state,groups_to_read);
  SelectionVector::Initialize(&state->sel,0x800);
  this_00 = &state->file_handle;
  if ((state->file_handle).
      super_unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::CachingFileHandle_*,_std::default_delete<duckdb::CachingFileHandle>_>
      .super__Head_base<0UL,_duckdb::CachingFileHandle_*,_false>._M_head_impl !=
      (CachingFileHandle *)0x0) {
    pCVar6 = unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
             ::operator->(this_00);
    CachingFileHandle::GetPath_abi_cxx11_((string *)&disable_prefetch,pCVar6);
    pCVar6 = unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
             ::operator->(&this->file_handle);
    CachingFileHandle::GetPath_abi_cxx11_((string *)&prefetch_all_files,pCVar6);
    bVar4 = ::std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &disable_prefetch,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &prefetch_all_files);
    ::std::__cxx11::string::~string((string *)&prefetch_all_files);
    ::std::__cxx11::string::~string((string *)&disable_prefetch);
    if (!bVar4) goto LAB_01db1ad3;
  }
  Value::Value(&disable_prefetch,0);
  Value::Value(&prefetch_all_files,0);
  ::std::__cxx11::string::string
            ((string *)(local_108 + 8),"disable_parquet_prefetching",(allocator *)local_108);
  ClientContext::TryGetCurrentSetting(context,(string *)(local_108 + 8),&disable_prefetch);
  ::std::__cxx11::string::~string((string *)(local_108 + 8));
  ::std::__cxx11::string::string
            ((string *)(local_108 + 8),"prefetch_all_parquet_files",(allocator *)local_108);
  ClientContext::TryGetCurrentSetting(context,(string *)(local_108 + 8),&prefetch_all_files);
  ::std::__cxx11::string::~string((string *)(local_108 + 8));
  this_01 = &this->file_handle;
  pCVar6 = unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
           ::operator->(this_01);
  bVar4 = CachingFileHandle::OnDiskFile(pCVar6);
  bVar5 = true;
  if (bVar4) {
    bVar5 = Value::GetValue<bool>(&prefetch_all_files);
  }
  pCVar6 = unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
           ::operator->(this_01);
  bVar4 = CachingFileHandle::CanSeek(pCVar6);
  if (bVar4) {
    bVar4 = Value::GetValue<bool>(&disable_prefetch);
    if (bVar4 || bVar5 != true) goto LAB_01db1a0f;
    state->prefetch_mode = true;
    pCVar6 = unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
             ::operator->(this_01);
    bVar4 = CachingFileHandle::IsRemoteFile(pCVar6);
    lVar10 = (ulong)bVar4 * 4 + 1;
  }
  else {
LAB_01db1a0f:
    state->prefetch_mode = false;
    lVar10 = 1;
  }
  pCVar6 = unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
           ::operator->(this_01);
  CachingFileHandle::GetPath_abi_cxx11_(&local_90,pCVar6);
  OpenFileInfo::OpenFileInfo((OpenFileInfo *)(local_108 + 8),&local_90);
  flags.lock = (char)lVar10;
  flags.compression = (char)((ulong)lVar10 >> 8);
  flags._10_6_ = (int6)((ulong)lVar10 >> 0x10);
  flags.flags = (idx_t)(local_108 + 8);
  CachingFileSystem::OpenFile((CachingFileSystem *)local_108,(OpenFileInfo *)&this->fs,flags);
  __p = local_108;
  local_108 = (undefined1  [8])0x0;
  ::std::__uniq_ptr_impl<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>_>
  ::reset((__uniq_ptr_impl<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>_>
           *)this_00,(pointer)__p);
  ::std::unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>_>::
  ~unique_ptr((unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>_>
               *)local_108);
  OpenFileInfo::~OpenFileInfo((OpenFileInfo *)(local_108 + 8));
  ::std::__cxx11::string::~string((string *)&local_90);
  Value::~Value(&prefetch_all_files);
  Value::~Value(&disable_prefetch);
LAB_01db1ad3:
  ::std::__uniq_ptr_impl<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>_>::
  reset((__uniq_ptr_impl<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>_> *)
        &state->adaptive_filter,(pointer)0x0);
  ::std::vector<duckdb::ParquetScanFilter,_std::allocator<duckdb::ParquetScanFilter>_>::clear
            (&(state->scan_filters).
              super_vector<duckdb::ParquetScanFilter,_std::allocator<duckdb::ParquetScanFilter>_>);
  if ((this->super_BaseFileReader).filters.
      super_unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>._M_t.
      super___uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::TableFilterSet_*,_std::default_delete<duckdb::TableFilterSet>_>
      .super__Head_base<0UL,_duckdb::TableFilterSet_*,_false>._M_head_impl != (TableFilterSet *)0x0)
  {
    this_02 = &(this->super_BaseFileReader).filters;
    args = unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>::
           operator*(this_02);
    make_uniq<duckdb::AdaptiveFilter,duckdb::TableFilterSet&>((duckdb *)&disable_prefetch,args);
    uVar3 = disable_prefetch.type_._0_8_;
    disable_prefetch.type_.id_ = INVALID;
    disable_prefetch.type_.physical_type_ = ~INVALID;
    disable_prefetch.type_._2_6_ = 0;
    ::std::__uniq_ptr_impl<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>_>::
    reset((__uniq_ptr_impl<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>_> *)
          &state->adaptive_filter,(pointer)uVar3);
    ::std::unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>_>::
    ~unique_ptr((unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>_> *)
                &disable_prefetch);
    pTVar7 = unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>::
             operator->(this_02);
    for (p_Var8 = (pTVar7->filters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var8 != &(pTVar7->filters)._M_t._M_impl.super__Rb_tree_header;
        p_Var8 = (_Base_ptr)::std::_Rb_tree_increment(p_Var8)) {
      __args_2 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                 operator*((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                            *)&p_Var8[1]._M_parent);
      ::std::vector<duckdb::ParquetScanFilter,std::allocator<duckdb::ParquetScanFilter>>::
      emplace_back<duckdb::ClientContext&,unsigned_long_const&,duckdb::TableFilter&>
                ((vector<duckdb::ParquetScanFilter,std::allocator<duckdb::ParquetScanFilter>> *)
                 &state->scan_filters,context,(unsigned_long *)(p_Var8 + 1),__args_2);
    }
  }
  pCVar9 = unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
           ::operator*(this_00);
  CreateThriftFileProtocol((CachingFileHandle *)&disable_prefetch,SUB81(pCVar9,0));
  pTVar1 = (state->thrift_file_proto)._M_t.
           super___uniq_ptr_impl<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb_apache::thrift::protocol::TProtocol_*,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>_>
           .super__Head_base<0UL,_duckdb_apache::thrift::protocol::TProtocol_*,_false>._M_head_impl;
  (state->thrift_file_proto)._M_t.
  super___uniq_ptr_impl<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb_apache::thrift::protocol::TProtocol_*,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>_>
  .super__Head_base<0UL,_duckdb_apache::thrift::protocol::TProtocol_*,_false>._M_head_impl =
       (TProtocol *)disable_prefetch.type_._0_8_;
  if (pTVar1 != (TProtocol *)0x0) {
    (*pTVar1->_vptr_TProtocol[1])();
  }
  CreateReader((ParquetReader *)&disable_prefetch,(ClientContext *)this);
  uVar3 = disable_prefetch.type_._0_8_;
  disable_prefetch.type_.id_ = INVALID;
  disable_prefetch.type_.physical_type_ = ~INVALID;
  disable_prefetch.type_._2_6_ = 0;
  _Var2._M_head_impl =
       (state->root_reader).
       super_unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>._M_t.
       super___uniq_ptr_impl<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnReader_*,_std::default_delete<duckdb::ColumnReader>_>.
       super__Head_base<0UL,_duckdb::ColumnReader_*,_false>._M_head_impl;
  (state->root_reader).
  super_unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>._M_t.
  super___uniq_ptr_impl<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnReader_*,_std::default_delete<duckdb::ColumnReader>_>.
  super__Head_base<0UL,_duckdb::ColumnReader_*,_false>._M_head_impl = (ColumnReader *)uVar3;
  if (_Var2._M_head_impl != (ColumnReader *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_ColumnReader + 8))();
    if (disable_prefetch.type_._0_8_ != 0) {
      (**(code **)(*(long *)disable_prefetch.type_._0_8_ + 8))();
    }
  }
  ResizeableBuffer::resize(&state->define_buf,this->allocator,0x800);
  ResizeableBuffer::resize(&state->repeat_buf,this->allocator,0x800);
  return;
}

Assistant:

void ParquetReader::InitializeScan(ClientContext &context, ParquetReaderScanState &state,
                                   vector<idx_t> groups_to_read) {
	state.current_group = -1;
	state.finished = false;
	state.offset_in_group = 0;
	state.group_idx_list = std::move(groups_to_read);
	state.sel.Initialize(STANDARD_VECTOR_SIZE);
	if (!state.file_handle || state.file_handle->GetPath() != file_handle->GetPath()) {
		auto flags = FileFlags::FILE_FLAGS_READ;

		Value disable_prefetch = false;
		Value prefetch_all_files =
#ifdef DUCKDB_PREFETCH_ALL_PARQUET_FILES
		    true; // For debugging purposes we can toggle this to always enable
#else
		    false; // Defaults to false
#endif
		context.TryGetCurrentSetting("disable_parquet_prefetching", disable_prefetch);
		context.TryGetCurrentSetting("prefetch_all_parquet_files", prefetch_all_files);
		bool should_prefetch = !file_handle->OnDiskFile() || prefetch_all_files.GetValue<bool>();
		bool can_prefetch = file_handle->CanSeek() && !disable_prefetch.GetValue<bool>();

		if (should_prefetch && can_prefetch) {
			state.prefetch_mode = true;
			if (file_handle->IsRemoteFile()) {
				flags |= FileFlags::FILE_FLAGS_DIRECT_IO;
			}
		} else {
			state.prefetch_mode = false;
		}

		state.file_handle = fs.OpenFile(file_handle->GetPath(), flags);
	}
	state.adaptive_filter.reset();
	state.scan_filters.clear();
	if (filters) {
		state.adaptive_filter = make_uniq<AdaptiveFilter>(*filters);
		for (auto &entry : filters->filters) {
			state.scan_filters.emplace_back(context, entry.first, *entry.second);
		}
	}

	state.thrift_file_proto = CreateThriftFileProtocol(*state.file_handle, state.prefetch_mode);
	state.root_reader = CreateReader(context);
	state.define_buf.resize(allocator, STANDARD_VECTOR_SIZE);
	state.repeat_buf.resize(allocator, STANDARD_VECTOR_SIZE);
}